

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int InterpolatePlane(uint8_t *src0,int src_stride0,uint8_t *src1,int src_stride1,uint8_t *dst,
                    int dst_stride,int width,int height,int interpolation)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  long lVar5;
  
  iVar1 = -1;
  if (height != 0 &&
      (0 < width && (dst != (uint8_t *)0x0 && (src1 != (uint8_t *)0x0 && src0 != (uint8_t *)0x0))))
  {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      dst = dst + ~height * dst_stride;
      dst_stride = -dst_stride;
    }
    if (dst_stride == width && (src_stride1 == width && src_stride0 == width)) {
      width = width * iVar1;
      iVar1 = 1;
      src_stride0 = 0;
      src_stride1 = 0;
      dst_stride = 0;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar4 = InterpolateRow_SSSE3;
    }
    else {
      pcVar4 = InterpolateRow_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar4 = InterpolateRow_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0x1fU) == 0) {
      pcVar3 = InterpolateRow_AVX2;
    }
    else {
      pcVar3 = InterpolateRow_Any_AVX2;
    }
    if ((uVar2 >> 10 & 1) == 0) {
      pcVar3 = pcVar4;
    }
    lVar5 = (long)src1 - (long)src0;
    do {
      (*pcVar3)(dst,src0,lVar5,width,interpolation);
      src0 = src0 + src_stride0;
      dst = dst + dst_stride;
      lVar5 = lVar5 + ((long)src_stride1 - (long)src_stride0);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int InterpolatePlane(const uint8_t* src0,
                     int src_stride0,
                     const uint8_t* src1,
                     int src_stride1,
                     uint8_t* dst,
                     int dst_stride,
                     int width,
                     int height,
                     int interpolation) {
  int y;
  void (*InterpolateRow)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  if (!src0 || !src1 || !dst || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst = dst + (height - 1) * dst_stride;
    dst_stride = -dst_stride;
  }
  // Coalesce rows.
  if (src_stride0 == width && src_stride1 == width && dst_stride == width) {
    width *= height;
    height = 1;
    src_stride0 = src_stride1 = dst_stride = 0;
  }
#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    InterpolateRow = InterpolateRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      InterpolateRow = InterpolateRow_MMI;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    InterpolateRow(dst, src0, src1 - src0, width, interpolation);
    src0 += src_stride0;
    src1 += src_stride1;
    dst += dst_stride;
  }
  return 0;
}